

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O2

void expand_blake2b(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                   uint32_t len)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t *puVar9;
  uint32_t key_len;
  long lVar10;
  ulong uVar11;
  uint8_t *data;
  uint uVar12;
  uint8_t *puVar13;
  uint32_t data_len;
  uint32_t data_len_00;
  undefined4 in_register_0000008c;
  ulong uVar14;
  uint8_t *__dest;
  uint8_t *dst;
  undefined8 uStack_80;
  uint8_t auStack_78 [8];
  ulong local_70 [3];
  uint local_54;
  uint8_t *local_50 [2];
  uint8_t *local_40;
  uint32_t local_34;
  
  local_50[1] = auStack_78;
  local_70[2] = CONCAT44(in_register_0000008c,len);
  local_54 = len >> 6;
  uVar11 = (ulong)(infolen + 0x41);
  uVar14 = uVar11 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar14;
  dst = auStack_78 + lVar1;
  puVar13 = (uint8_t *)0x0;
  local_70[0] = uVar11;
  local_50[0] = prk;
  local_40 = info;
  local_34 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x160383;
  memset(dst,0,uVar11);
  puVar9 = local_40;
  __dest = local_50[1] + (0x40 - uVar14);
  local_50[1] = (uint8_t *)(ulong)infolen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x1603a4;
  memcpy(__dest,puVar9,(ulong)infolen);
  local_70[1] = (ulong)(infolen + 1);
  local_40 = (uint8_t *)(ulong)((uint)local_70[2] & 0xffffffc0);
  lVar10 = 0;
  while( true ) {
    key_len = local_34;
    puVar9 = local_50[0];
    data_len_00 = (uint32_t)local_70[0];
    data_len = (uint32_t)local_70[1];
    if (local_40 == puVar13) break;
    __dest[(long)local_50[1]] = (uint8_t)(lVar10 + 1);
    data = __dest;
    if (lVar10 != 0) {
      data = dst;
      data_len = data_len_00;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x1603f6;
    EverCrypt_HMAC_compute_blake2b(dst,puVar9,key_len,data,data_len);
    uVar2 = *(undefined8 *)dst;
    uVar3 = *(undefined8 *)((long)local_70 + lVar1);
    uVar4 = *(undefined8 *)((long)local_70 + lVar1 + 8);
    uVar5 = *(undefined8 *)((long)local_70 + lVar1 + 0x10);
    uVar6 = *(undefined8 *)(&stack0xffffffffffffffa8 + lVar1);
    uVar7 = *(undefined8 *)((long)local_50 + lVar1);
    uVar8 = *(undefined8 *)((long)&local_40 + lVar1);
    *(undefined8 *)(okm + (long)(puVar13 + 0x30)) = *(undefined8 *)((long)local_50 + lVar1 + 8);
    *(undefined8 *)(okm + (long)(puVar13 + 0x30) + 8) = uVar8;
    *(undefined8 *)(okm + (long)(puVar13 + 0x20)) = uVar6;
    *(undefined8 *)(okm + (long)(puVar13 + 0x20) + 8) = uVar7;
    *(undefined8 *)(okm + (long)(puVar13 + 0x10)) = uVar4;
    *(undefined8 *)(okm + (long)(puVar13 + 0x10) + 8) = uVar5;
    *(undefined8 *)(okm + (long)puVar13) = uVar2;
    *(undefined8 *)(okm + (long)puVar13 + 8) = uVar3;
    puVar13 = puVar13 + 0x40;
    lVar10 = lVar10 + 1;
  }
  uVar12 = (uint)local_70[2];
  if ((uint)local_40 != uVar12) {
    __dest[(long)local_50[1]] = (char)local_54 + '\x01';
    puVar13 = dst;
    if (uVar12 < 0x40) {
      puVar13 = __dest;
      data_len_00 = data_len;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x16046b;
    EverCrypt_HMAC_compute_blake2b(dst,puVar9,key_len,puVar13,data_len_00);
    uVar11 = (ulong)local_40 & 0xffffffff;
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x160482;
    memcpy(okm + uVar11,dst,(ulong)(uVar12 & 0x3f));
  }
  return;
}

Assistant:

static void
expand_blake2b(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 64U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}